

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<const_unsigned_long>_>::flattenTo
          (Delimited<kj::ArrayPtr<const_unsigned_long>_> *this,char *target)

{
  size_t sVar1;
  CappedArray<char,_26UL> *pCVar2;
  char *__src;
  size_t sVar3;
  size_t __n;
  long lVar4;
  bool bVar5;
  
  ensureStringifiedInitialized(this);
  sVar1 = (this->stringified).size_;
  if (sVar1 != 0) {
    pCVar2 = (this->stringified).ptr;
    bVar5 = true;
    lVar4 = 0;
    do {
      if (bVar5) {
        bVar5 = false;
      }
      else {
        __src = (this->delimiter).content.ptr;
        sVar3 = (this->delimiter).content.size_;
        if (__src != __src + (sVar3 - 1)) {
          memcpy(target,__src,sVar3 - 1);
          target = target + (sVar3 - 1);
        }
      }
      __n = *(size_t *)(pCVar2->content + lVar4 + -8);
      if (__n != 0) {
        memcpy(target,pCVar2->content + lVar4,__n);
        target = target + __n;
      }
      lVar4 = lVar4 + 0x28;
    } while (sVar1 * 0x28 != lVar4);
  }
  return target;
}

Assistant:

char* flattenTo(char* __restrict__ target) {
    ensureStringifiedInitialized();

    bool first = true;
    for (auto& elem: stringified) {
      if (first) {
        first = false;
      } else {
        target = fill(target, delimiter);
      }
      target = fill(target, elem);
    }
    return target;
  }